

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_avx2.c
# Opt level: O0

void av1_highbd_convolve_2d_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined8 uVar48;
  undefined8 uVar49;
  undefined8 uVar50;
  undefined8 uVar51;
  int in_ECX;
  int iVar52;
  long lVar53;
  long in_RDX;
  int in_ESI;
  undefined1 *puVar54;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar56 [32];
  __m128i v;
  __m128i v_00;
  long in_stack_00000008;
  undefined4 in_stack_0000002c;
  __m256i res_16bit;
  __m256i res_b_round;
  __m256i res_b;
  __m256i res_a_round;
  __m256i res_a;
  __m256i s7;
  __m256i s6;
  int16_t *data;
  __m256i s5;
  __m256i s4;
  __m256i s3;
  __m256i s2;
  __m256i s1;
  __m256i s0;
  __m256i res;
  __m256i res_odd1;
  __m256i res_even1;
  __m256i res_odd;
  __m256i res_even;
  __m256i r1;
  __m256i r0;
  __m256i row1;
  __m256i row0;
  __m256i zero;
  __m256i clip_pixel;
  __m256i round_const_bits;
  __m128i round_shift_bits;
  int bits;
  __m128i round_shift_y;
  __m256i round_const_y;
  __m128i round_shift_x;
  __m256i round_const_x;
  __m256i coeffs_x [4];
  __m256i coeffs_y [4];
  __m256i s [8];
  uint16_t *src_ptr;
  int fo_horiz;
  int fo_vert;
  int j;
  int i;
  int im_stride;
  int im_h;
  int16_t im_block [1120];
  undefined4 in_stack_ffffffffffffe574;
  undefined4 in_stack_ffffffffffffe58c;
  int in_stack_ffffffffffffe590;
  __m256i *in_stack_ffffffffffffe598;
  undefined2 in_stack_ffffffffffffe5a4;
  int iVar58;
  undefined4 uVar59;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  __m256i *coeffs;
  __m256i *s_00;
  undefined1 in_stack_ffffffffffffe600 [32];
  undefined8 local_19e0;
  undefined8 *puStack_19c8;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  byte local_16d4;
  undefined1 local_15e0 [128];
  undefined1 local_1560 [32];
  undefined1 local_1540 [32];
  undefined1 local_1520 [32];
  undefined1 local_1500 [32];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [32];
  undefined1 local_1480 [32];
  long local_1460;
  int local_1458;
  int local_1454;
  uint local_1450;
  int local_144c;
  int local_1448;
  int local_1444;
  undefined8 local_1440 [281];
  int local_b74;
  int local_b70;
  int local_b6c;
  long local_b68;
  int local_b5c;
  uint local_b4c;
  uint local_b48;
  uint local_b44;
  undefined1 local_b40 [16];
  uint local_b24;
  undefined1 local_b20 [16];
  uint local_b04;
  undefined1 local_b00 [16];
  uint local_ae8;
  ushort local_ae2;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 (*local_aa0) [32];
  undefined1 (*local_a98) [32];
  undefined8 *local_a90;
  undefined8 *local_a88;
  undefined8 *local_a80;
  undefined8 *local_a78;
  undefined8 *local_a70;
  undefined8 *local_a68;
  undefined8 *local_a60;
  undefined1 (*local_a58) [32];
  ulong local_a50;
  undefined8 uStack_a48;
  undefined1 local_a40 [32];
  ulong local_a10;
  undefined8 uStack_a08;
  undefined1 local_a00 [32];
  ulong local_9d0;
  undefined8 uStack_9c8;
  undefined1 local_9c0 [32];
  ulong local_990;
  undefined8 uStack_988;
  undefined1 in_stack_fffffffffffff680 [32];
  uint16_t *in_stack_fffffffffffff6a0;
  undefined8 local_180;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  iVar58 = (int)conv_params;
  if (*(short *)(in_stack_00000008 + 8) == 0xc) {
    av1_highbd_convolve_2d_sr_ssse3
              (in_stack_fffffffffffff6a0,in_stack_fffffffffffff680._28_4_,
               in_stack_fffffffffffff680._16_8_,in_stack_fffffffffffff680._12_4_,
               in_stack_fffffffffffff680._8_4_,in_stack_fffffffffffff680._4_4_,filter_params_x,
               (InterpFilterParams *)CONCAT44(in_stack_ffffffffffffe574,filter_params_y._0_4_),
               subpel_x_qn,subpel_y_qn,
               (ConvolveParams *)CONCAT44(in_stack_ffffffffffffe58c,(int)conv_params),
               in_stack_ffffffffffffe590);
  }
  else {
    local_1444 = in_R9D + -1 + (uint)filter_params_x->taps;
    local_1448 = 8;
    local_1454 = (filter_params_x->taps >> 1) - 1;
    local_1458 = (*(ushort *)(in_stack_00000008 + 8) >> 1) - 1;
    local_1460 = in_RDI + (long)(local_1454 * in_ESI) * -2 + (long)local_1458 * -2;
    iVar52 = (1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) & 0x1f)) >> 1;
    local_b44 = iVar52 + (1 << ((char)conv_params + 6U & 0x1f));
    auVar2 = vpinsrd_avx(ZEXT416(local_b44),local_b44,1);
    auVar2 = vpinsrd_avx(auVar2,local_b44,2);
    auVar2 = vpinsrd_avx(auVar2,local_b44,3);
    auVar3 = vpinsrd_avx(ZEXT416(local_b44),local_b44,1);
    auVar3 = vpinsrd_avx(auVar3,local_b44,2);
    auVar3 = vpinsrd_avx(auVar3,local_b44,3);
    uStack_130 = auVar3._0_8_;
    uStack_128 = auVar3._8_8_;
    local_ae8 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14);
    local_b00._4_4_ = 0;
    local_b00._0_4_ = local_ae8;
    uVar50 = local_b00._0_8_;
    local_b48 = ((1 << (*(byte *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18) & 0x1f)) >> 1) -
                (1 << (((char)conv_params -
                       (char)*(undefined4 *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14)) + 0xdU
                      & 0x1f));
    auVar3 = vpinsrd_avx(ZEXT416(local_b48),local_b48,1);
    auVar3 = vpinsrd_avx(auVar3,local_b48,2);
    auVar3 = vpinsrd_avx(auVar3,local_b48,3);
    auVar57 = vpinsrd_avx(ZEXT416(local_b48),local_b48,1);
    auVar57 = vpinsrd_avx(auVar57,local_b48,2);
    auVar57 = vpinsrd_avx(auVar57,local_b48,3);
    uStack_f0 = auVar57._0_8_;
    uStack_e8 = auVar57._8_8_;
    local_b04 = *(uint *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18);
    local_b20._4_4_ = 0;
    local_b20._0_4_ = local_b04;
    uVar49 = local_b20._0_8_;
    local_b24 = 0xe - (*(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x14) +
                      *(int *)(CONCAT44(in_stack_0000002c,subpel_y_qn) + 0x18));
    local_b40._4_4_ = 0;
    local_b40._0_4_ = local_b24;
    uVar48 = local_b40._0_8_;
    local_16d4 = (byte)local_b24;
    local_b4c = (1 << (local_16d4 & 0x1f)) >> 1;
    auVar57 = vpinsrd_avx(ZEXT416(local_b4c),local_b4c,1);
    auVar57 = vpinsrd_avx(auVar57,local_b4c,2);
    auVar57 = vpinsrd_avx(auVar57,local_b4c,3);
    auVar55 = vpinsrd_avx(ZEXT416(local_b4c),local_b4c,1);
    auVar55 = vpinsrd_avx(auVar55,local_b4c,2);
    auVar55 = vpinsrd_avx(auVar55,local_b4c,3);
    auVar55 = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar55;
    auVar57 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
    if (iVar58 == 10) {
      uVar59 = 0x3ff;
    }
    else {
      uVar59 = 0xff;
      if (iVar58 == 0xc) {
        uVar59 = 0xfff;
      }
    }
    local_ae2 = (ushort)uVar59;
    iVar58 = CONCAT22(local_ae2,in_stack_ffffffffffffe5a4);
    auVar4 = vpinsrw_avx(ZEXT216(local_ae2),uVar59,1);
    auVar4 = vpinsrw_avx(auVar4,uVar59,2);
    auVar4 = vpinsrw_avx(auVar4,uVar59,3);
    auVar4 = vpinsrw_avx(auVar4,uVar59,4);
    auVar4 = vpinsrw_avx(auVar4,uVar59,5);
    auVar4 = vpinsrw_avx(auVar4,uVar59,6);
    auVar4 = vpinsrw_avx(auVar4,uVar59,7);
    auVar5 = vpinsrw_avx(ZEXT216(local_ae2),uVar59,1);
    auVar5 = vpinsrw_avx(auVar5,uVar59,2);
    auVar5 = vpinsrw_avx(auVar5,uVar59,3);
    auVar5 = vpinsrw_avx(auVar5,uVar59,4);
    auVar5 = vpinsrw_avx(auVar5,uVar59,5);
    auVar5 = vpinsrw_avx(auVar5,uVar59,6);
    auVar5 = vpinsrw_avx(auVar5,uVar59,7);
    uStack_70 = auVar5._0_8_;
    uStack_68 = auVar5._8_8_;
    local_ac0._8_8_ = SUB328(ZEXT832(0),4);
    uVar51 = local_ac0._8_8_;
    local_b74 = in_R9D;
    local_b70 = in_R8D;
    local_b6c = in_ECX;
    local_b68 = in_RDX;
    local_b5c = in_ESI;
    local_b40 = ZEXT416(local_b24);
    local_b20 = ZEXT416(local_b04);
    local_b00 = ZEXT416(local_ae8);
    local_ac0 = ZEXT832(0) << 0x20;
    prepare_coeffs((InterpFilterParams *)CONCAT44(iVar52,uVar59),iVar58,in_stack_ffffffffffffe598);
    prepare_coeffs((InterpFilterParams *)CONCAT44(iVar52,uVar59),iVar58,in_stack_ffffffffffffe598);
    for (local_1450 = 0; (int)local_1450 < local_b70; local_1450 = local_1450 + 8) {
      for (local_144c = 0; local_144c < local_1444; local_144c = local_144c + 2) {
        local_a58 = (undefined1 (*) [32])
                    (local_1460 + (long)(int)(local_144c * local_b5c + local_1450) * 2);
        local_ae0._8_8_ = SUB328(ZEXT832(0),4);
        local_17a0 = 0;
        uStack_1798 = local_ae0._8_8_;
        uStack_1790 = 0;
        uStack_1788 = 0;
        if (local_144c + 1 < local_1444) {
          local_a60 = (undefined8 *)
                      (local_1460 + (long)(int)((local_144c + 1) * local_b5c + local_1450) * 2);
          local_17a0 = *local_a60;
          uStack_1798 = local_a60[1];
          uStack_1790 = local_a60[2];
          uStack_1788 = local_a60[3];
        }
        auVar24._8_8_ = uStack_1798;
        auVar24._0_8_ = local_17a0;
        auVar24._16_8_ = uStack_1790;
        auVar24._24_8_ = uStack_1788;
        auVar7 = vperm2i128_avx2(*local_a58,auVar24,0x20);
        auVar25._8_8_ = uStack_1798;
        auVar25._0_8_ = local_17a0;
        auVar25._16_8_ = uStack_1790;
        auVar25._24_8_ = uStack_1788;
        auVar8 = vperm2i128_avx2(*local_a58,auVar25,0x31);
        local_1540 = vpalignr_avx2(auVar8,auVar7,4);
        local_1520 = vpalignr_avx2(auVar8,auVar7,8);
        auVar56 = vpalignr_avx2(auVar8,auVar7,0xc);
        local_1560 = auVar7;
        local_1500 = auVar56;
        local_ae0 = ZEXT832(0) << 0x20;
        convolve(in_stack_ffffffffffffe600._16_8_,in_stack_ffffffffffffe600._8_8_);
        auVar36._16_8_ = uStack_130;
        auVar36._0_16_ = auVar2;
        auVar36._24_8_ = uStack_128;
        auVar56 = vpaddd_avx2(auVar56,auVar36);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = uVar50;
        auVar6 = vpsrad_avx2(auVar56,auVar30);
        local_1560 = vpalignr_avx2(auVar8,auVar7,2);
        local_1540 = vpalignr_avx2(auVar8,auVar7,6);
        local_1520 = vpalignr_avx2(auVar8,auVar7,10);
        auVar56 = vpalignr_avx2(auVar8,auVar7,0xe);
        local_1500 = auVar56;
        convolve(in_stack_ffffffffffffe600._16_8_,in_stack_ffffffffffffe600._8_8_);
        auVar35._16_8_ = uStack_130;
        auVar35._0_16_ = auVar2;
        auVar35._24_8_ = uStack_128;
        auVar56 = vpaddd_avx2(auVar56,auVar35);
        auVar29._8_8_ = 0;
        auVar29._0_8_ = uVar50;
        auVar7 = vpsrad_avx2(auVar56,auVar29);
        auVar56 = vpackssdw_avx2(auVar6,auVar6);
        auVar6 = vpackssdw_avx2(auVar7,auVar7);
        auVar56 = vpunpcklwd_avx2(auVar56,auVar6);
        lVar53 = (long)(local_144c * local_1448) * 2;
        local_1880 = auVar56._0_8_;
        uStack_1878 = auVar56._8_8_;
        uStack_1870 = auVar56._16_8_;
        uStack_1868 = auVar56._24_8_;
        *(undefined8 *)((long)local_1440 + lVar53) = local_1880;
        *(undefined8 *)((long)local_1440 + lVar53 + 8) = uStack_1878;
        *(undefined8 *)((long)local_1440 + lVar53 + 0x10) = uStack_1870;
        *(undefined8 *)((long)local_1440 + lVar53 + 0x18) = uStack_1868;
      }
      local_a68 = local_1440;
      auVar47._8_8_ = local_1440[1];
      auVar47._0_8_ = local_1440[0];
      auVar47._16_8_ = local_1440[2];
      auVar47._24_8_ = local_1440[3];
      auVar46._8_8_ = local_1440[1];
      auVar46._0_8_ = local_1440[0];
      auVar46._16_8_ = local_1440[2];
      auVar46._24_8_ = local_1440[3];
      lVar53 = (long)local_1448 * 2;
      local_a70 = (undefined8 *)((long)local_1440 + lVar53);
      uVar9 = *(undefined8 *)((long)local_1440 + lVar53 + 8);
      uVar10 = *(undefined8 *)((long)local_1440 + lVar53 + 0x10);
      uVar11 = *(undefined8 *)((long)local_1440 + lVar53 + 0x18);
      lVar53 = (long)(local_1448 * 2) * 2;
      local_a78 = (undefined8 *)((long)local_1440 + lVar53);
      uVar12 = *(undefined8 *)((long)local_1440 + lVar53 + 8);
      uVar13 = *(undefined8 *)((long)local_1440 + lVar53 + 0x10);
      uVar14 = *(undefined8 *)((long)local_1440 + lVar53 + 0x18);
      lVar53 = (long)(local_1448 * 3) * 2;
      local_a80 = (undefined8 *)((long)local_1440 + lVar53);
      uVar15 = *(undefined8 *)((long)local_1440 + lVar53 + 8);
      uVar16 = *(undefined8 *)((long)local_1440 + lVar53 + 0x10);
      uVar17 = *(undefined8 *)((long)local_1440 + lVar53 + 0x18);
      lVar53 = (long)(local_1448 << 2) * 2;
      local_a88 = (undefined8 *)((long)local_1440 + lVar53);
      uVar18 = *(undefined8 *)((long)local_1440 + lVar53 + 8);
      uVar19 = *(undefined8 *)((long)local_1440 + lVar53 + 0x10);
      uVar20 = *(undefined8 *)((long)local_1440 + lVar53 + 0x18);
      lVar53 = (long)(local_1448 * 5) * 2;
      local_a90 = (undefined8 *)((long)local_1440 + lVar53);
      uVar21 = *(undefined8 *)((long)local_1440 + lVar53 + 8);
      uVar22 = *(undefined8 *)((long)local_1440 + lVar53 + 0x10);
      uVar23 = *(undefined8 *)((long)local_1440 + lVar53 + 0x18);
      auVar37._8_8_ = uVar9;
      auVar37._0_8_ = *local_a70;
      auVar37._16_8_ = uVar10;
      auVar37._24_8_ = uVar11;
      local_1560 = vpunpcklwd_avx2(auVar46,auVar37);
      auVar8._8_8_ = uVar12;
      auVar8._0_8_ = *local_a78;
      auVar8._16_8_ = uVar13;
      auVar8._24_8_ = uVar14;
      auVar7._8_8_ = uVar15;
      auVar7._0_8_ = *local_a80;
      auVar7._16_8_ = uVar16;
      auVar7._24_8_ = uVar17;
      local_1540 = vpunpcklwd_avx2(auVar8,auVar7);
      auVar6._8_8_ = uVar18;
      auVar6._0_8_ = *local_a88;
      auVar6._16_8_ = uVar19;
      auVar6._24_8_ = uVar20;
      auVar56._8_8_ = uVar21;
      auVar56._0_8_ = *local_a90;
      auVar56._16_8_ = uVar22;
      auVar56._24_8_ = uVar23;
      local_1520 = vpunpcklwd_avx2(auVar6,auVar56);
      auVar42._8_8_ = uVar9;
      auVar42._0_8_ = *local_a70;
      auVar42._16_8_ = uVar10;
      auVar42._24_8_ = uVar11;
      local_14e0 = vpunpckhwd_avx2(auVar47,auVar42);
      auVar41._8_8_ = uVar12;
      auVar41._0_8_ = *local_a78;
      auVar41._16_8_ = uVar13;
      auVar41._24_8_ = uVar14;
      auVar40._8_8_ = uVar15;
      auVar40._0_8_ = *local_a80;
      auVar40._16_8_ = uVar16;
      auVar40._24_8_ = uVar17;
      local_14c0 = vpunpckhwd_avx2(auVar41,auVar40);
      auVar39._8_8_ = uVar18;
      auVar39._0_8_ = *local_a88;
      auVar39._16_8_ = uVar19;
      auVar39._24_8_ = uVar20;
      auVar38._8_8_ = uVar21;
      auVar38._0_8_ = *local_a90;
      auVar38._16_8_ = uVar22;
      auVar38._24_8_ = uVar23;
      local_14a0 = vpunpckhwd_avx2(auVar39,auVar38);
      for (local_144c = 0; local_144c < local_b74; local_144c = local_144c + 2) {
        lVar53 = (long)(local_144c * local_1448) * 2 + -0x1440;
        local_a98 = (undefined1 (*) [32])
                    ((long)local_1440 + (long)(local_1448 * 6) * 2 + lVar53 + 0x1440);
        local_aa0 = (undefined1 (*) [32])
                    ((long)local_1440 + (long)(local_1448 * 7) * 2 + lVar53 + 0x1440);
        local_1500 = vpunpcklwd_avx2(*local_a98,*local_aa0);
        auVar56 = vpunpckhwd_avx2(*local_a98,*local_aa0);
        puVar54 = local_15e0;
        s_00 = in_stack_ffffffffffffe600._16_8_;
        coeffs = in_stack_ffffffffffffe600._8_8_;
        local_1480 = auVar56;
        convolve(s_00,coeffs);
        uStack_1708 = auVar57._8_8_;
        uStack_1710 = auVar57._0_8_;
        auVar34._16_8_ = uStack_f0;
        auVar34._0_16_ = auVar3;
        auVar34._24_8_ = uStack_e8;
        auVar56 = vpaddd_avx2(auVar56,auVar34);
        local_990 = uVar49;
        uStack_988 = 0;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = uVar49;
        auVar56 = vpsrad_avx2(auVar56,auVar28);
        auVar33._16_8_ = uStack_1710;
        auVar33._0_16_ = auVar55;
        auVar33._24_8_ = uStack_1708;
        local_9c0 = vpaddd_avx2(auVar56,auVar33);
        local_9d0 = uVar48;
        uStack_9c8 = 0;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = uVar48;
        auVar56 = vpsrad_avx2(local_9c0,auVar5);
        if ((int)(local_b70 - local_1450) < 5) {
          if (local_b70 == 4) {
            auVar56 = vpackssdw_avx2(auVar56,auVar56);
            auVar44._16_8_ = uStack_70;
            auVar44._0_16_ = auVar4;
            auVar44._24_8_ = uStack_68;
            auVar56 = vpminsw_avx2(auVar56,auVar44);
            auVar56 = vpmaxsw_avx2(auVar56,ZEXT832((ulong)uVar51) << 0x40);
            local_19e0 = auVar56._0_8_;
            *(undefined8 *)(local_b68 + (long)(int)(local_144c * local_b6c + local_1450) * 2) =
                 local_19e0;
            puStack_19c8 = auVar56._24_8_;
            *puStack_19c8 = local_180;
          }
          else {
            auVar56 = vpackssdw_avx2(auVar56,auVar56);
            auVar43._16_8_ = uStack_70;
            auVar43._0_16_ = auVar4;
            auVar43._24_8_ = uStack_68;
            auVar56 = vpminsw_avx2(auVar56,auVar43);
            vpmaxsw_avx2(auVar56,ZEXT832((ulong)uVar51) << 0x40);
            v[1]._0_4_ = local_1450;
            v[0] = (longlong)puVar54;
            v[1]._4_4_ = 0;
            xx_storel_32((void *)(local_b68 + (long)(int)(local_144c * local_b6c + local_1450) * 2),
                         v);
            v_00[0] = (ulong)local_1450;
            v_00[1]._0_4_ = local_b6c;
            v_00[1]._4_4_ = 0;
            xx_storel_32((void *)(local_b68 +
                                 (long)(int)(local_144c * local_b6c + local_1450 + local_b6c) * 2),
                         v_00);
          }
        }
        else {
          in_stack_ffffffffffffe600 = auVar56;
          convolve(s_00,coeffs);
          auVar32._16_8_ = uStack_f0;
          auVar32._0_16_ = auVar3;
          auVar32._24_8_ = uStack_e8;
          local_a00 = vpaddd_avx2(in_stack_ffffffffffffe600,auVar32);
          local_a10 = uVar49;
          uStack_a08 = 0;
          auVar27._8_8_ = 0;
          auVar27._0_8_ = uVar49;
          auVar6 = vpsrad_avx2(local_a00,auVar27);
          auVar31._16_8_ = uStack_1710;
          auVar31._0_16_ = auVar55;
          auVar31._24_8_ = uStack_1708;
          local_a40 = vpaddd_avx2(auVar6,auVar31);
          local_a50 = uVar48;
          uStack_a48 = 0;
          auVar26._8_8_ = 0;
          auVar26._0_8_ = uVar48;
          auVar6 = vpsrad_avx2(local_a40,auVar26);
          auVar56 = vpackssdw_avx2(auVar56,auVar6);
          auVar45._16_8_ = uStack_70;
          auVar45._0_16_ = auVar4;
          auVar45._24_8_ = uStack_68;
          auVar56 = vpminsw_avx2(auVar56,auVar45);
          auVar56 = vpmaxsw_avx2(auVar56,ZEXT832((ulong)uVar51) << 0x40);
          puVar1 = (undefined8 *)(local_b68 + (long)(int)(local_144c * local_b6c + local_1450) * 2);
          local_1a40 = auVar56._0_8_;
          uStack_1a38 = auVar56._8_8_;
          uStack_1a30 = auVar56._16_8_;
          uStack_1a28 = auVar56._24_8_;
          *puVar1 = local_1a40;
          puVar1[1] = uStack_1a38;
          puVar1 = (undefined8 *)
                   (local_b68 + (long)(int)(local_144c * local_b6c + local_1450 + local_b6c) * 2);
          *puVar1 = uStack_1a30;
          puVar1[1] = uStack_1a28;
        }
        local_1560 = local_1540;
        local_1540 = local_1520;
        local_1520 = local_1500;
        local_14e0 = local_14c0;
        local_14c0 = local_14a0;
        local_14a0 = local_1480;
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_avx2(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn,
                                    const int subpel_y_qn,
                                    ConvolveParams *conv_params, int bd) {
  if (filter_params_x->taps == 12) {
    av1_highbd_convolve_2d_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                    filter_params_x, filter_params_y,
                                    subpel_x_qn, subpel_y_qn, conv_params, bd);
    return;
  }

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);
        __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);
          res_b_round =
              _mm256_sra_epi32(_mm256_add_epi32(res_b_round, round_const_bits),
                               round_shift_bits);

          __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
          res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
          res_16bit = _mm256_max_epi16(res_16bit, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_16bit));
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_16bit, 1));
        } else if (w == 4) {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_a_round));
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_a_round, 1));
        } else {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          xx_storel_32(&dst[i * dst_stride + j],
                       _mm256_castsi256_si128(res_a_round));
          xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                       _mm256_extracti128_si256(res_a_round, 1));
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}